

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O0

bool __thiscall
cmCTestCurl::UploadFile
          (cmCTestCurl *this,string *param_1,string *url,string *fields,string *response)

{
  undefined1 *puVar1;
  cmCTest *pcVar2;
  Curl_easy *data;
  bool bVar3;
  char *pcVar4;
  FILE *__stream;
  ostream *poVar5;
  undefined8 uVar6;
  unsigned_long uVar7;
  reference pbVar8;
  ulong uVar9;
  string local_af0 [32];
  undefined1 local_ad0 [8];
  ostringstream cmCTestLog_msg_5;
  string local_958 [32];
  undefined1 local_938 [8];
  ostringstream cmCTestLog_msg_4;
  allocator<char> local_7b9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_7b8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_7b0;
  string local_7a8 [32];
  string local_788 [8];
  string curlDebug;
  undefined1 local_748 [8];
  ostringstream cmCTestLog_msg_3;
  allocator<char> local_5c9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_5c8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_5c0;
  string local_5b8 [32];
  undefined1 local_598 [8];
  vector<char,_std::allocator<char>_> debugData;
  vector<char,_std::allocator<char>_> responseData;
  undefined1 local_548 [8];
  ostringstream cmCTestLog_msg_2;
  string *h;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  curl_slist *headers;
  unsigned_long filelen;
  string upload_url;
  ostringstream local_360 [8];
  ostringstream cmCTestLog_msg_1;
  FILE *ftpfile;
  ostringstream local_1b0 [8];
  ostringstream cmCTestLog_msg;
  string *response_local;
  string *fields_local;
  string *url_local;
  string *local_file_local;
  cmCTestCurl *this_local;
  
  std::__cxx11::string::clear();
  bVar3 = InitCurl(this);
  if (bVar3) {
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_UPLOAD,1);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_PUT,1);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_VERBOSE,1);
    __stream = (FILE *)cmsys::SystemTools::Fopen(param_1,"rb");
    if (__stream == (FILE *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_360);
      poVar5 = std::operator<<((ostream *)local_360,"Could not open file for upload: ");
      poVar5 = std::operator<<(poVar5,(string *)param_1);
      std::operator<<(poVar5,"\n");
      pcVar2 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0x81,pcVar4,false);
      std::__cxx11::string::~string((string *)(upload_url.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream(local_360);
      this_local._7_1_ = false;
    }
    else {
      std::__cxx11::string::string((string *)&filelen,(string *)url);
      std::__cxx11::string::operator+=((string *)&filelen,"?");
      std::__cxx11::string::operator+=((string *)&filelen,(string *)fields);
      data = (Curl_easy *)this->Curl;
      uVar6 = std::__cxx11::string::c_str();
      curl_easy_setopt(data,CURLOPT_URL,uVar6);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_READDATA,__stream);
      uVar7 = cmsys::SystemTools::FileLength(param_1);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_INFILESIZE,uVar7);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEFUNCTION,
                       anon_unknown.dwarf_208c6a::curlWriteMemoryCallback);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGFUNCTION,
                       anon_unknown.dwarf_208c6a::curlDebugCallback);
      __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->HttpHeaders);
      h = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->HttpHeaders);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&h), bVar3) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_548);
        poVar5 = std::operator<<((ostream *)local_548,"   Add HTTP Header: \"");
        poVar5 = std::operator<<(poVar5,(string *)pbVar8);
        poVar5 = std::operator<<(poVar5,"\"");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0x99,pcVar4,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string
                  ((string *)
                   &responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10)
        ;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_548);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)curl_slist_append((curl_slist *)__range1,pcVar4);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTPHEADER,__range1);
      puVar1 = &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)puVar1);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_598);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEDATA,puVar1);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGDATA,local_598);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_FAILONERROR,1);
      curl_easy_perform((Curl_easy *)this->Curl);
      fclose(__stream);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTPHEADER,0);
      curl_slist_free_all((curl_slist *)__range1);
      bVar3 = std::vector<char,_std::allocator<char>_>::empty
                        ((vector<char,_std::allocator<char>_> *)
                         &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          field_0x10);
      if (!bVar3) {
        puVar1 = &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
        local_5c0._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::begin
                               ((vector<char,_std::allocator<char>_> *)puVar1);
        local_5c8._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::end
                               ((vector<char,_std::allocator<char>_> *)puVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                  (local_5b8,local_5c0,local_5c8,&local_5c9);
        std::__cxx11::string::operator=((string *)response,local_5b8);
        std::__cxx11::string::~string(local_5b8);
        std::allocator<char>::~allocator(&local_5c9);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_748);
        poVar5 = std::operator<<((ostream *)local_748,"Curl response: [");
        poVar5 = std::operator<<(poVar5,(string *)response);
        std::operator<<(poVar5,"]\n");
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xab,pcVar4,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string((string *)(curlDebug.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_748);
      }
      std::__cxx11::string::string(local_788);
      bVar3 = std::vector<char,_std::allocator<char>_>::empty
                        ((vector<char,_std::allocator<char>_> *)local_598);
      if (!bVar3) {
        local_7b0._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::begin
                               ((vector<char,_std::allocator<char>_> *)local_598);
        local_7b8._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::end
                               ((vector<char,_std::allocator<char>_> *)local_598);
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                  (local_7a8,local_7b0,local_7b8,&local_7b9);
        std::__cxx11::string::operator=(local_788,local_7a8);
        std::__cxx11::string::~string(local_7a8);
        std::allocator<char>::~allocator(&local_7b9);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_938);
        poVar5 = std::operator<<((ostream *)local_938,"Curl debug: [");
        poVar5 = std::operator<<(poVar5,local_788);
        std::operator<<(poVar5,"]\n");
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xb1,pcVar4,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_958);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_938);
      }
      uVar9 = std::__cxx11::string::empty();
      bVar3 = (uVar9 & 1) != 0;
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ad0);
        poVar5 = std::operator<<((ostream *)local_ad0,"No response from server.\n");
        std::operator<<(poVar5,local_788);
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xb6,pcVar4,false);
        std::__cxx11::string::~string(local_af0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ad0);
      }
      this_local._7_1_ = !bVar3;
      std::__cxx11::string::~string(local_788);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_598);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)
                 &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::__cxx11::string::~string((string *)&filelen);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::operator<<((ostream *)local_1b0,"Initialization of curl failed");
    pcVar2 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0x74,pcVar4,false);
    std::__cxx11::string::~string((string *)&ftpfile);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestCurl::UploadFile(std::string const& local_file,
                             std::string const& url, std::string const& fields,
                             std::string& response)
{
  response.clear();
  if (!this->InitCurl()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Initialization of curl failed");
    return false;
  }
  /* enable uploading */
  curl_easy_setopt(this->Curl, CURLOPT_UPLOAD, 1);

  /* HTTP PUT please */
  ::curl_easy_setopt(this->Curl, CURLOPT_PUT, 1);
  ::curl_easy_setopt(this->Curl, CURLOPT_VERBOSE, 1);

  FILE* ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
  if (!ftpfile) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Could not open file for upload: " << local_file << "\n");
    return false;
  }
  // set the url
  std::string upload_url = url;
  upload_url += "?";
  upload_url += fields;
  ::curl_easy_setopt(this->Curl, CURLOPT_URL, upload_url.c_str());
  // now specify which file to upload
  ::curl_easy_setopt(this->Curl, CURLOPT_INFILE, ftpfile);
  unsigned long filelen = cmSystemTools::FileLength(local_file);
  // and give the size of the upload (optional)
  ::curl_easy_setopt(this->Curl, CURLOPT_INFILESIZE,
                     static_cast<long>(filelen));
  ::curl_easy_setopt(this->Curl, CURLOPT_WRITEFUNCTION,
                     curlWriteMemoryCallback);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGFUNCTION, curlDebugCallback);
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");
  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(this->Curl, CURLOPT_HTTPHEADER, headers);
  std::vector<char> responseData;
  std::vector<char> debugData;
  ::curl_easy_setopt(this->Curl, CURLOPT_FILE, &responseData);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGDATA, &debugData);
  ::curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);
  // Now run off and do what you've been told!
  ::curl_easy_perform(this->Curl);
  ::fclose(ftpfile);
  ::curl_easy_setopt(this->Curl, CURLOPT_HTTPHEADER, NULL);
  ::curl_slist_free_all(headers);

  if (!responseData.empty()) {
    response = std::string(responseData.begin(), responseData.end());
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Curl response: [" << response << "]\n", this->Quiet);
  }
  std::string curlDebug;
  if (!debugData.empty()) {
    curlDebug = std::string(debugData.begin(), debugData.end());
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Curl debug: [" << curlDebug << "]\n", this->Quiet);
  }
  if (response.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "No response from server.\n"
                 << curlDebug);
    return false;
  }
  return true;
}